

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

xchar deepest_lev_reached(boolean noquest)

{
  schar sVar1;
  int iVar2;
  char local_13;
  d_level local_12;
  int local_10;
  schar ret;
  d_level tmp;
  int i;
  boolean noquest_local;
  
  local_13 = '\0';
  tmp.dlevel = noquest;
  for (local_10 = 0; local_10 < n_dgns; local_10 = local_10 + 1) {
    local_12.dlevel = dungeons[local_10].dunlev_ureached;
    if ((local_12.dlevel != '\0') &&
       ((iVar2 = strcmp(dungeons[local_10].dname,"The Quest"), iVar2 != 0 || (tmp.dlevel == '\0'))))
    {
      local_12.dnum = (xchar)local_10;
      sVar1 = depth(&local_12);
      if (local_13 < sVar1) {
        local_13 = depth(&local_12);
      }
    }
  }
  return local_13;
}

Assistant:

xchar deepest_lev_reached(boolean noquest)
{
	/* this function is used for three purposes: to provide a factor
	 * of difficulty in monster generation; to provide a factor of
	 * difficulty in experience calculations (botl.c and end.c); and
	 * to insert the deepest level reached in the game in the topten
	 * display.  the 'noquest' arg switch is required for the latter.
	 *
	 * from the player's point of view, going into the Quest is _not_
	 * going deeper into the dungeon -- it is going back "home", where
	 * the dungeon starts at level 1.  given the setup in dungeon.def,
	 * the depth of the Quest (thought of as starting at level 1) is
	 * never lower than the level of entry into the Quest, so we exclude
	 * the Quest from the topten "deepest level reached" display
	 * calculation.  _However_ the Quest is a difficult dungeon, so we
	 * include it in the factor of difficulty calculations.
	 */
	int i;
	d_level tmp;
	schar ret = 0;

	for (i = 0; i < n_dgns; i++) {
	    if ((tmp.dlevel = dungeons[i].dunlev_ureached) == 0) continue;
	    if (!strcmp(dungeons[i].dname, "The Quest") && noquest) continue;

	    tmp.dnum = i;
	    if (depth(&tmp) > ret) ret = depth(&tmp);
	}
	return (xchar) ret;
}